

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_ws_emit_handler(ws_session_t *session)

{
  nh_ws_out_context_t *ctx;
  _func_void_ws_session_t_ptr *p_Var1;
  int iVar2;
  undefined1 local_24 [8];
  epoll_event ev;
  
  ctx = session->incomplete_emit;
  while( true ) {
    if (ctx == (nh_ws_out_context_t *)0x0) {
      return;
    }
    iVar2 = nh_write_socket(&ctx->stream,session->socket);
    if (iVar2 == 0) break;
    if ((ctx->stream).index != (ctx->stream).length) {
      local_24._0_4_ = 0x80000004;
      unique0x00004780 = &session->emit_handler;
      epoll_ctl(session->server->loop,3,session->socket,(epoll_event *)local_24);
      return;
    }
    nh_ws_out_context_free(ctx);
    ctx = session->incomplete_emit->next;
    session->incomplete_emit = ctx;
    if (ctx == (nh_ws_out_context_t *)0x0) {
      session->incomplete_emit_tail = (nh_ws_out_context_t *)0x0;
      if ((session->flags & 2) == 0) {
        return;
      }
      p_Var1 = session->ws_handlers->on_closed;
      if (p_Var1 != (_func_void_ws_session_t_ptr *)0x0) {
        (*p_Var1)(session);
      }
      nh_ws_session_free(session);
      ctx = session->incomplete_emit;
    }
  }
  p_Var1 = session->ws_handlers->on_closed;
  if (p_Var1 != (_func_void_ws_session_t_ptr *)0x0) {
    (*p_Var1)(session);
  }
  nh_ws_session_free(session);
  return;
}

Assistant:

void nh_ws_emit_handler(ws_session_t *session) {
    nh_ws_out_context_t *ctx;
    while ((ctx = session->incomplete_emit) != NULL) {
        if (!nh_write_socket(&ctx->stream, session->socket)) {
            // pipe error, cancel and close session
            CALL_SESSION_CALLBACK(session->ws_handlers->on_closed, session);
            nh_ws_session_free(session);
            return;
        }

        if (ctx->stream.index != ctx->stream.length) {
            // need wait writable
            struct epoll_event ev;
            ev.events = EPOLLOUT | EPOLLET;
            ev.data.ptr = &session->emit_handler;
            epoll_ctl(session->server->loop, EPOLL_CTL_MOD, session->socket, &ev);
            return;
        }

        // success and free memory
        nh_ws_out_context_free(ctx);

        if ((session->incomplete_emit = session->incomplete_emit->next) == NULL) {
            // the last one
            session->incomplete_emit_tail = NULL;
            if (FLAG_CHECK(session->flags, WEBSOCKET_SESSION_CLOSE)) {
                CALL_SESSION_CALLBACK(session->ws_handlers->on_closed, session);
                nh_ws_session_free(session);
            }
        }
    }
}